

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

bool Js::JavascriptLibrary::InitializeProxyPrototype
               (DynamicObject *proxyPrototype,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *this;
  RuntimeFunction **ppRVar1;
  JavascriptLibrary *library;
  DeferredInitializeMode mode_local;
  DeferredTypeHandlerBase *typeHandler_local;
  DynamicObject *proxyPrototype_local;
  
  DeferredTypeHandlerBase::Convert(typeHandler,proxyPrototype,mode,1,0);
  this = RecyclableObject::GetLibrary(&proxyPrototype->super_RecyclableObject);
  ppRVar1 = Memory::WriteBarrierPtr::operator_cast_to_RuntimeFunction__
                      ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).proxyConstructor);
  AddMember(this,proxyPrototype,0x67,*ppRVar1);
  DynamicObject::SetHasNoEnumerableProperties(proxyPrototype,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeProxyPrototype(DynamicObject* proxyPrototype, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(proxyPrototype, mode, 1);
        // Note: Any new function addition/deletion/modification should also be updated in JavascriptLibrary::ProfilerRegisterSymbol
        // so that the update is in sync with profiler
        JavascriptLibrary* library = proxyPrototype->GetLibrary();
        library->AddMember(proxyPrototype, PropertyIds::constructor, library->proxyConstructor);

        proxyPrototype->SetHasNoEnumerableProperties(true);

        return true;
    }